

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_deflate.cpp
# Opt level: O0

void __thiscall
ktx::CommandDeflate::Options::process
          (Options *this,Options *param_2,ParseResult *args,Reporter *report)

{
  OptionValue *option;
  bool *pbVar1;
  char *in_RDX;
  ParseResult *in_RDI;
  string *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  OptionValue *in_stack_ffffffffffffff80;
  string local_78 [8];
  char **in_stack_ffffffffffffff90;
  char **in_stack_ffffffffffffff98;
  char (*in_stack_ffffffffffffffa0) [35];
  Reporter *in_stack_ffffffffffffffa8;
  allocator<char> local_41;
  string local_40 [64];
  
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)kQuiet;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,in_RDX,(allocator<char> *)in_RDI);
  option = cxxopts::ParseResult::operator[](in_RDI,in_stack_ffffffffffffff58);
  pbVar1 = cxxopts::OptionValue::as<bool>(in_stack_ffffffffffffff80);
  *(byte *)&(in_RDI->m_keys)._M_h._M_buckets = *pbVar1 & 1;
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,in_RDX,(allocator<char> *)in_RDI);
  cxxopts::ParseResult::operator[](in_RDI,(string *)option);
  pbVar1 = cxxopts::OptionValue::as<bool>(in_stack_ffffffffffffff80);
  *(byte *)((long)&(in_RDI->m_keys)._M_h._M_buckets + 1) = *pbVar1 & 1;
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff87);
  if ((((ulong)(in_RDI->m_keys)._M_h._M_buckets & 1) != 0) &&
     (((ulong)(in_RDI->m_keys)._M_h._M_buckets & 0x100) != 0)) {
    Reporter::fatal_usage<char_const(&)[35],char_const*&,char_const*&>
              (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
               in_stack_ffffffffffffff90);
  }
  return;
}

Assistant:

void CommandDeflate::Options::process(cxxopts::Options&,
                                             cxxopts::ParseResult& args,
                                             Reporter& report) {
    quiet = args[kQuiet].as<bool>();
    warningsAsErrors = args[kWarningsAsErrors].as<bool>();
    if (quiet && warningsAsErrors) {
        report.fatal_usage("Cannot specify both --{} and --{}.",
                           this->kQuiet, this->kWarningsAsErrors);
    }
}